

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_percentile_tables.cpp
# Opt level: O0

bool is_legal_2d_block_size(uint xdim,uint ydim)

{
  uint uVar1;
  uint idx;
  uint ydim_local;
  uint xdim_local;
  bool local_1;
  
  uVar1 = xdim << 8 | ydim;
  if ((((((uVar1 == 0x404) || (uVar1 - 0x504 < 2)) || (uVar1 - 0x605 < 2)) ||
       ((uVar1 - 0x805 < 2 || (uVar1 == 0x808)))) ||
      ((uVar1 - 0xa05 < 2 || ((uVar1 == 0xa08 || (uVar1 == 0xa0a)))))) ||
     ((uVar1 == 0xc0a || (uVar1 == 0xc0c)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool is_legal_2d_block_size(
	unsigned int xdim,
	unsigned int ydim
) {
	unsigned int idx = (xdim << 8) | ydim;
	switch (idx)
	{
		case 0x0404:
		case 0x0504:
		case 0x0505:
		case 0x0605:
		case 0x0606:
		case 0x0805:
		case 0x0806:
		case 0x0808:
		case 0x0A05:
		case 0x0A06:
		case 0x0A08:
		case 0x0A0A:
		case 0x0C0A:
		case 0x0C0C:
			return true;
	}

	return false;
}